

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

clip_image_size llava_uhd::get_best_grid(int max_slice_nums,int multiple,float log_ratio)

{
  int iVar1;
  double dVar2;
  pointer pcVar3;
  clip_image_size cVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  clip_image_size *grid;
  pointer pcVar8;
  pointer piVar9;
  float fVar10;
  int i;
  int local_7c;
  double local_78;
  int *local_70;
  vector<clip_image_size,_std::allocator<clip_image_size>_> candidate_grids;
  vector<int,_std::allocator<int>_> candidate_split_grids_nums;
  
  local_78 = (double)CONCAT44(local_78._4_4_,log_ratio);
  candidate_split_grids_nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  candidate_split_grids_nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  candidate_split_grids_nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  candidate_grids.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)CONCAT44(multiple,multiple + -1);
  candidate_grids.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(candidate_grids.
                         super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>.
                         _M_impl.super__Vector_impl_data._M_finish._4_4_,multiple + 1);
  for (lVar6 = 0; lVar6 != 0xc; lVar6 = lVar6 + 4) {
    i = *(int *)((long)&candidate_grids.
                        super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar6);
    if (i <= max_slice_nums && i != 1) {
      std::vector<int,_std::allocator<int>_>::push_back(&candidate_split_grids_nums,&i);
    }
  }
  candidate_grids.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  candidate_grids.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  candidate_grids.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = candidate_split_grids_nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  for (piVar9 = candidate_split_grids_nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar3 = candidate_grids.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>
               ._M_impl.super__Vector_impl_data._M_finish, piVar9 != local_70; piVar9 = piVar9 + 1)
  {
    iVar1 = *piVar9;
    iVar7 = 0;
    if (0 < iVar1) {
      iVar7 = iVar1;
    }
    for (iVar5 = 1; iVar5 - iVar7 != 1; iVar5 = iVar5 + 1) {
      if (iVar1 % iVar5 == 0) {
        i = iVar5;
        local_7c = iVar1 / iVar5;
        std::vector<clip_image_size,_std::allocator<clip_image_size>_>::
        emplace_back<clip_image_size>(&candidate_grids,(clip_image_size *)&i);
      }
    }
  }
  local_78 = (double)local_78._0_4_;
  cVar4.width = 1;
  cVar4.height = 1;
  fVar10 = INFINITY;
  for (pcVar8 = candidate_grids.
                super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>._M_impl.
                super__Vector_impl_data._M_start; pcVar8 != pcVar3; pcVar8 = pcVar8 + 1) {
    local_70 = (int *)CONCAT44(local_70._4_4_,fVar10);
    dVar2 = log((double)(*pcVar8).width / (double)(*pcVar8).height);
    fVar10 = local_70._0_4_;
    if (ABS((float)(local_78 - dVar2)) < local_70._0_4_) {
      cVar4 = *pcVar8;
      fVar10 = ABS((float)(local_78 - dVar2));
    }
  }
  std::_Vector_base<clip_image_size,_std::allocator<clip_image_size>_>::~_Vector_base
            (&candidate_grids.super__Vector_base<clip_image_size,_std::allocator<clip_image_size>_>)
  ;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&candidate_split_grids_nums.super__Vector_base<int,_std::allocator<int>_>);
  return cVar4;
}

Assistant:

static clip_image_size get_best_grid(const int max_slice_nums, const int multiple, const float log_ratio) {
        std::vector<int> candidate_split_grids_nums;
        for (int i : {multiple - 1, multiple, multiple + 1}) {
            if (i == 1 || i > max_slice_nums) {
                continue;
            }
            candidate_split_grids_nums.push_back(i);
        }

        std::vector<clip_image_size> candidate_grids;
        for (int split_grids_nums : candidate_split_grids_nums) {
            int m = 1;
            while (m <= split_grids_nums) {
                if (split_grids_nums % m == 0) {
                    candidate_grids.push_back(clip_image_size{m, split_grids_nums / m});
                }
                ++m;
            }
        }

        clip_image_size best_grid{1, 1};
        float min_error = std::numeric_limits<float>::infinity();
        for (const auto& grid : candidate_grids) {
            float error = std::abs(log_ratio - std::log(1.0 * grid.width / grid.height));
            if (error < min_error) {
                best_grid = grid;
                min_error = error;
            }
        }
        return best_grid;
    }